

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_wskey.cpp
# Opt level: O0

void __thiscall Sha1_Test1_Test::TestBody(Sha1_Test1_Test *this)

{
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,_20UL>_>_>
  matcher;
  bool bVar1;
  size_t count;
  char *pcVar2;
  array<unsigned_char,_20UL> *rhs;
  result_type *digest_00;
  undefined8 in_stack_fffffffffffffe4c;
  AssertHelper local_158;
  Message local_150;
  string local_148;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  Message local_110 [3];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,_20UL>_>_>
  local_e0;
  char local_cc [20];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  result_type digest;
  undefined1 local_80 [8];
  sha1 sha;
  char test [3];
  Sha1_Test1_Test *this_local;
  
  sha._102_1_ = 99;
  sha.computed_ = true;
  sha.corrupted_ = true;
  pstore::http::sha1::sha1((sha1 *)local_80);
  count = pstore::array_elements<char_const,3ul>((char (*) [3])&sha.computed_);
  join_0x00000010_0x00000000_ =
       (storage_type<pstore::gsl::details::extent_type<_1L>_>)
       pstore::gsl::make_span<unsigned_char_const>(&sha.computed_,count);
  pstore::http::sha1::input
            ((sha1 *)local_80,(span<const_unsigned_char,__1L> *)(digest._M_elems + 0xc));
  pstore::http::sha1::result
            ((result_type *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4),(sha1 *)local_80);
  local_f8 = 0x6a810647363e99a9;
  uStack_f0 = 0x6cc2507871253eba;
  local_e8 = 0x9dd8d09c;
  testing::ContainerEq<std::array<unsigned_char,20ul>>(&local_e0,(testing *)&local_f8,rhs);
  matcher.impl_.expected_._M_elems[8] = local_e0.impl_.expected_._M_elems[0x10];
  matcher.impl_.expected_._M_elems[9] = local_e0.impl_.expected_._M_elems[0x11];
  matcher.impl_.expected_._M_elems[10] = local_e0.impl_.expected_._M_elems[0x12];
  matcher.impl_.expected_._M_elems[0xb] = local_e0.impl_.expected_._M_elems[0x13];
  matcher.impl_.expected_._M_elems[0] = local_e0.impl_.expected_._M_elems[8];
  matcher.impl_.expected_._M_elems[1] = local_e0.impl_.expected_._M_elems[9];
  matcher.impl_.expected_._M_elems[2] = local_e0.impl_.expected_._M_elems[10];
  matcher.impl_.expected_._M_elems[3] = local_e0.impl_.expected_._M_elems[0xb];
  matcher.impl_.expected_._M_elems[4] = local_e0.impl_.expected_._M_elems[0xc];
  matcher.impl_.expected_._M_elems[5] = local_e0.impl_.expected_._M_elems[0xd];
  matcher.impl_.expected_._M_elems[6] = local_e0.impl_.expected_._M_elems[0xe];
  matcher.impl_.expected_._M_elems[7] = local_e0.impl_.expected_._M_elems[0xf];
  matcher.impl_.expected_._M_elems[0xc] = (char)in_stack_fffffffffffffe4c;
  matcher.impl_.expected_._M_elems[0xd] = (char)((ulong)in_stack_fffffffffffffe4c >> 8);
  matcher.impl_.expected_._M_elems[0xe] = (char)((ulong)in_stack_fffffffffffffe4c >> 0x10);
  matcher.impl_.expected_._M_elems[0xf] = (char)((ulong)in_stack_fffffffffffffe4c >> 0x18);
  matcher.impl_.expected_._M_elems[0x10] = (char)((ulong)in_stack_fffffffffffffe4c >> 0x20);
  matcher.impl_.expected_._M_elems[0x11] = (char)((ulong)in_stack_fffffffffffffe4c >> 0x28);
  matcher.impl_.expected_._M_elems[0x12] = (char)((ulong)in_stack_fffffffffffffe4c >> 0x30);
  matcher.impl_.expected_._M_elems[0x13] = (char)((ulong)in_stack_fffffffffffffe4c >> 0x38);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,20ul>>>>
            (matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,20ul>>>>
  ::operator()((AssertionResult *)local_b8,local_cc,(array<unsigned_char,_20UL> *)"digest");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_wskey.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  pstore::http::sha1::digest_to_base64_abi_cxx11_
            (&local_148,
             (sha1 *)((long)&gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4),digest_00);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[29],_nullptr>
            ((EqHelper *)local_128,"pstore::http::sha1::digest_to_base64 (digest)",
             "\"qZk+NkcGgWq6PiVxeFDCbJzQ2J0=\"",&local_148,
             (char (*) [29])"qZk+NkcGgWq6PiVxeFDCbJzQ2J0=");
  std::__cxx11::string::~string((string *)&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_wskey.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  return;
}

Assistant:

TEST (Sha1, Test1) {
    char const test[] = {'a', 'b', 'c'};
    PSTORE_STATIC_ASSERT (sizeof (char) == sizeof (std::uint8_t));

    pstore::http::sha1 sha;
    sha.input (pstore::gsl::make_span (reinterpret_cast<std::uint8_t const *> (test),
                                       pstore::array_elements (test)));
    pstore::http::sha1::result_type const digest = sha.result ();
    EXPECT_THAT (digest, testing::ContainerEq (pstore::http::sha1::result_type{
                             {0xA9, 0x99, 0x3E, 0x36, 0x47, 0x06, 0x81, 0x6A, 0xBA, 0x3E,
                              0x25, 0x71, 0x78, 0x50, 0xC2, 0x6C, 0x9C, 0xD0, 0xD8, 0x9D}}));

    EXPECT_EQ (pstore::http::sha1::digest_to_base64 (digest), "qZk+NkcGgWq6PiVxeFDCbJzQ2J0=");
}